

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O2

bool __thiscall duckdb::AlpCompressionState<float>::HasEnoughSpace(AlpCompressionState<float> *this)

{
  data_ptr_t pdVar1;
  
  pdVar1 = BufferHandle::Ptr(&this->handle);
  return pdVar1 + ((ulong)(this->state).exceptions_count * 6 +
                   this->data_bytes_used + (this->state).bp_size + 0x18 & 0xfffffffffffffff8) <
         this->metadata_ptr + -4;
}

Assistant:

bool HasEnoughSpace() {
		//! If [start of block + used space + required space] is more than whats left (current position
		//! of metadata pointer - the size of a new metadata pointer)
		if ((handle.Ptr() + AlignValue(UsedSpace() + RequiredSpace())) >=
		    (metadata_ptr - AlpConstants::METADATA_POINTER_SIZE)) {
			return false;
		}
		return true;
	}